

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

_Bool get_int_from_string(char *s,int *val)

{
  _Bool _Var1;
  long lVar2;
  char *endptr;
  char *local_20;
  
  lVar2 = strtol(s,&local_20,10);
  if (*s == '\0') {
LAB_0013224b:
    _Var1 = false;
  }
  else {
    if (*local_20 == '\0') {
      if (lVar2 - 0x7fffffffU < 0xffffffff00000002) goto LAB_0013224b;
    }
    else {
      _Var1 = contains_only_spaces(local_20);
      if (!_Var1 || 0x7ffffffe < lVar2 + 0x7fffffffU >> 1) goto LAB_0013224b;
    }
    *val = (int)lVar2;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool get_int_from_string(const char *s, int *val)
{
	char *endptr;
	long lval = strtol(s, &endptr, 10);

	/*
	 * Reject INT_MIN and INT_MAX so, for systems where
	 * sizeof(long) == sizeof(int), it isn't necessary to check errno to
	 * see if the value in the string was out of range.
	 */
	if (s[0] == '\0' ||
			(*endptr != '\0' && !contains_only_spaces(endptr)) ||
			lval <= INT_MIN || lval >= INT_MAX) {
		return false;
	}
	*val = (int)lval;
	return true;
}